

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O1

void Commands::do_punishment
               (Command_Source *from,Character *victim,
               function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *f,bool announce)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  string local_90;
  string local_70;
  string local_50;
  World *__args;
  
  iVar1 = (*from->_vptr_Command_Source[4])();
  __args = (World *)CONCAT44(extraout_var,iVar1);
  if ((victim == (Character *)0x0) || (victim->nowhere == true)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"character_not_found","");
    I18N::Format<>(&local_50,&__args->i18n,&local_90);
    (*from->_vptr_Command_Source[5])(from,&local_50);
    local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0012d908;
  }
  else {
    iVar1 = (**(victim->super_Command_Source)._vptr_Command_Source)(victim);
    iVar2 = (**from->_vptr_Command_Source)(from);
    if ((byte)iVar1 < (byte)iVar2) {
      std::function<void_(World_*,_Command_Source_*,_Character_*,_bool)>::operator()
                (f,__args,from,victim,announce);
      return;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"command_access_denied","");
    I18N::Format<>(&local_70,&__args->i18n,&local_90);
    (*from->_vptr_Command_Source[5])(from,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0012d908;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_0012d908:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void do_punishment(Command_Source* from, Character* victim, std::function<void(World*, Command_Source*, Character*, bool)> f, bool announce)
{
	World* world = from->SourceWorld();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < from->SourceAccess())
		{
			f(world, from, victim, announce);
		}
		else
		{
			from->ServerMsg(world->i18n.Format("command_access_denied"));
		}
	}
}